

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O0

void __thiscall
TPZFMatrix<std::complex<float>_>::TPZFMatrix
          (TPZFMatrix<std::complex<float>_> *this,void **vtt,int64_t rows,int64_t cols,
          complex<float> *val)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  complex<float> *this_00;
  long in_RCX;
  complex<float> *pcVar4;
  long in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  undefined8 *in_R8;
  int64_t i;
  int64_t size;
  int64_t in_stack_ffffffffffffff78;
  int64_t in_stack_ffffffffffffff80;
  ulong uVar5;
  void **in_stack_ffffffffffffff88;
  TPZManVector<int,_5> *in_stack_ffffffffffffff90;
  complex<float> *pcVar6;
  long local_48;
  
  TPZMatrix<std::complex<float>_>::TPZMatrix
            ((TPZMatrix<std::complex<float>_> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
             in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  *in_RDI = *in_RSI;
  in_RDI[4] = 0;
  in_RDI[5] = 0;
  in_RDI[6] = 0;
  TPZManVector<int,_5>::TPZManVector(in_stack_ffffffffffffff90,(int64_t)in_stack_ffffffffffffff88);
  TPZVec<std::complex<float>_>::TPZVec((TPZVec<std::complex<float>_> *)(in_RDI + 0xe));
  uVar2 = in_RDX * in_RCX;
  if (uVar2 != 0) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar2;
    uVar3 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    uVar5 = uVar2;
    this_00 = (complex<float> *)operator_new__(uVar3);
    pcVar6 = this_00;
    if (uVar5 != 0) {
      pcVar4 = this_00 + uVar5;
      do {
        std::complex<float>::complex(this_00,0.0,0.0);
        this_00 = this_00 + 1;
      } while (this_00 != pcVar4);
    }
    in_RDI[4] = pcVar6;
    for (local_48 = 0; local_48 < (long)uVar2; local_48 = local_48 + 1) {
      *(undefined8 *)(in_RDI[4] + local_48 * 8) = *in_R8;
    }
  }
  return;
}

Assistant:

inline TPZFMatrix<TVar>::TPZFMatrix(const int64_t rows,const int64_t cols,const TVar & val )
: TPZRegisterClassId(&TPZFMatrix<TVar>::ClassId), TPZMatrix<TVar>( rows, cols ), 
 fElem(0), fGiven(0), fSize(0) {
    int64_t size = rows * cols;
    if(!size) return;
    fElem=new TVar[size];
#ifdef PZDEBUG
    if ( fElem == NULL && size) Error( "Constructor <memory allocation error>." );
#endif
    for(int64_t i=0;i<size;i++) fElem[i] = val;
}